

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O3

int __thiscall
websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::listen
          (endpoint<websocketpp::config::asio::transport_config> *this,int __fd,int __n)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  size_t in_RCX;
  undefined4 in_register_00000014;
  error_code *peVar3;
  error_category *extraout_RDX;
  int af;
  undefined4 in_register_00000034;
  error_code *ec;
  error_code eVar4;
  error_code eVar5;
  error_code bec;
  error_code local_68;
  shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>_> local_58;
  error_category *local_40;
  boolean<1,_2> local_34;
  
  peVar3 = (error_code *)CONCAT44(in_register_00000014,__n);
  if (this->m_state == READY) {
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              ((this->m_alog).
               super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,0x400,"asio::listen",in_RCX);
    local_68._M_value = 0;
    local_68._M_cat = (error_category *)std::_V2::system_category();
    peVar1 = (this->m_acceptor).
             super___shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    af = (uint)(((sockaddr *)CONCAT44(in_register_00000034,__fd))->sa_family != 2) * 8 + 2;
    local_40 = local_68._M_cat;
    eVar4 = ::asio::detail::reactive_socket_service_base::do_open
                      (&((peVar1->
                         super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>
                         ).service_)->super_reactive_socket_service_base,
                       &(peVar1->
                        super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>
                        ).implementation_.super_base_implementation_type,af,1,6,&local_68);
    if (eVar4._M_value == 0) {
      (peVar1->super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>).
      implementation_.protocol_.family_ = af;
    }
    ec = &local_68;
    if (local_68._M_value == 0) {
      peVar1 = (this->m_acceptor).
               super___shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      local_34.value_ = (int)this->m_reuse_addr;
      ::asio::detail::reactive_socket_service<asio::ip::tcp>::
      set_option<asio::detail::socket_option::boolean<1,2>>
                ((peVar1->
                 super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>).
                 service_,&(peVar1->
                           super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>
                           ).implementation_,&local_34,&local_68);
      ec = &local_68;
      if (local_68._M_value == 0) {
        if ((this->m_tcp_pre_bind_handler).super__Function_base._M_manager != (_Manager_type)0x0) {
          local_58.
          super___shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (this->m_acceptor).
                    super___shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          local_58.
          super___shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi =
               (this->m_acceptor).
               super___shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          p_Var2 = (this->m_acceptor).
                   super___shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
              UNLOCK();
              if ((this->m_tcp_pre_bind_handler).super__Function_base._M_manager ==
                  (_Manager_type)0x0) {
                std::__throw_bad_function_call();
              }
            }
            else {
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            }
          }
          eVar5 = (*(this->m_tcp_pre_bind_handler)._M_invoker)
                            ((_Any_data *)&this->m_tcp_pre_bind_handler,&local_58);
          *(error_code *)&peVar3->_M_value = eVar5;
          peVar3->_M_cat = extraout_RDX;
          if (local_58.
              super___shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_58.
                       super___shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
            eVar5 = *(error_code *)&peVar3->_M_value;
          }
          ec = peVar3;
          if (eVar5 != (error_code)0x0) goto LAB_0018c3e5;
        }
        peVar1 = (this->m_acceptor).
                 super___shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        ::asio::detail::reactive_socket_service<asio::ip::tcp>::bind
                  ((peVar1->
                   super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>
                   ).service_,(int)peVar1 + 8,(sockaddr *)CONCAT44(in_register_00000034,__fd),
                   (socklen_t)&local_68);
        ec = &local_68;
        if ((local_68._M_value == 0) &&
           (peVar1 = (this->m_acceptor).
                     super___shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,
           ::asio::detail::reactive_socket_service_base::listen
                     (&((peVar1->
                        super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>
                        ).service_)->super_reactive_socket_service_base,(int)peVar1 + 8,
                      this->m_listen_backlog), ec = &local_68, local_68._M_value == 0)) {
          this->m_state = LISTENING;
          peVar3->_M_value = 0;
          goto LAB_0018c425;
        }
      }
    }
LAB_0018c3e5:
    eVar5 = clean_up_listen_after_error<std::error_code>(this,ec);
    local_40 = eVar5._0_8_;
    peVar3->_M_value = eVar5._M_value;
    peVar3->_M_cat = eVar5._M_cat;
  }
  else {
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
              ((this->m_elog).
               super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,2,"asio::listen called from the wrong state",in_RCX);
    if (websocketpp::error::get_category()::instance == '\0') {
      listen();
    }
    peVar3->_M_value = 9;
    local_40 = (error_category *)&websocketpp::error::get_category()::instance;
LAB_0018c425:
    peVar3->_M_cat = local_40;
  }
  return (int)local_40;
}

Assistant:

void listen(lib::asio::ip::tcp::endpoint const & ep, lib::error_code & ec)
    {
        if (m_state != READY) {
            m_elog->write(log::elevel::library,
                "asio::listen called from the wrong state");
            using websocketpp::error::make_error_code;
            ec = make_error_code(websocketpp::error::invalid_state);
            return;
        }

        m_alog->write(log::alevel::devel,"asio::listen");

        lib::asio::error_code bec;

        m_acceptor->open(ep.protocol(),bec);
        if (bec) {ec = clean_up_listen_after_error(bec);return;}
        
        m_acceptor->set_option(lib::asio::socket_base::reuse_address(m_reuse_addr),bec);
        if (bec) {ec = clean_up_listen_after_error(bec);return;}
        
        // if a TCP pre-bind handler is present, run it
        if (m_tcp_pre_bind_handler) {
            ec = m_tcp_pre_bind_handler(m_acceptor);
            if (ec) {
                ec = clean_up_listen_after_error(ec);
                return;
            }
        }
        
        m_acceptor->bind(ep,bec);
        if (bec) {ec = clean_up_listen_after_error(bec);return;}
        
        m_acceptor->listen(m_listen_backlog,bec);
        if (bec) {ec = clean_up_listen_after_error(bec);return;}
        
        // Success
        m_state = LISTENING;
        ec = lib::error_code();
    }